

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Aig_Man_t * Abc_NtkToDarBmc(Abc_Ntk_t *pNtk,Vec_Int_t **pvMap)

{
  ulong *puVar1;
  long *plVar2;
  ulong uVar3;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar4;
  Vec_Ptr_t *pVVar5;
  void **__ptr;
  uint *__ptr_00;
  void *pvVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  void *pvVar11;
  Aig_Man_t *p;
  char *pcVar12;
  Abc_Obj_t *pAVar13;
  Aig_Obj_t *pAVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  size_t __size;
  ulong uVar19;
  uint uVar20;
  Aig_Man_t *pAVar21;
  int iVar22;
  ulong uVar23;
  
  pVVar5 = pNtk->vBoxes;
  if (0 < pVVar5->nSize) {
    lVar15 = 0;
    iVar16 = 0;
    do {
      pvVar6 = pVVar5->pArray[lVar15];
      uVar20 = *(uint *)((long)pvVar6 + 0x14) & 0xf;
      if ((uVar20 == 8) && (*(long *)((long)pvVar6 + 0x38) == 3)) {
        *(undefined8 *)((long)pvVar6 + 0x38) = 1;
        iVar16 = iVar16 + 1;
        pVVar5 = pNtk->vBoxes;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar5->nSize);
    if (iVar16 != 0) {
      Abc_Print(uVar20,"Warning: %d registers in this network have don\'t-care init values.\n");
      Abc_Print(uVar20,"The don\'t-care are assumed to be 0. The result may not verify.\n");
      Abc_Print(uVar20,"Use command \"print_latch\" to see the init values of registers.\n");
      Abc_Print(uVar20,"Use command \"zero\" to convert or \"init\" to change the values.\n");
    }
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  __ptr = (void **)malloc(800);
  pVVar5->pArray = __ptr;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  pvVar6 = malloc(800);
  *(void **)(__ptr_00 + 2) = pvVar6;
  if (pvMap != (Vec_Int_t **)0x0) {
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    *pvMap = pVVar7;
  }
  pVVar9 = pNtk->vPos;
  if (pVVar9->nSize < 1) {
    uVar19 = 0;
  }
  else {
    uVar19 = 0;
    uVar23 = 100;
    lVar15 = 0;
    do {
      plVar2 = (long *)pVVar9->pArray[lVar15];
      uVar3 = *(ulong *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      uVar18 = (ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1);
      iVar16 = (int)uVar19;
      if (lVar15 < pNtk->nConstrs || (long)pNtk->nConstrs == 0) {
        Abc_CollectTopOr((Abc_Obj_t *)(uVar18 ^ uVar3),pVVar5);
        iVar22 = pVVar5->nSize;
        if (0 < (long)iVar22) {
          lVar10 = (long)iVar16;
          uVar20 = iVar16 * 2;
          __size = lVar10 << 4;
          lVar17 = 0;
          do {
            pvVar6 = pVVar5->pArray[lVar17];
            if (iVar16 + (int)lVar17 == (int)uVar23) {
              pvVar11 = *(void **)(__ptr_00 + 2);
              if (lVar10 + lVar17 < 0x10) {
                if (pvVar11 == (void *)0x0) {
                  pvVar11 = malloc(0x80);
                }
                else {
                  pvVar11 = realloc(pvVar11,0x80);
                }
                *(void **)(__ptr_00 + 2) = pvVar11;
                uVar23 = 0x10;
              }
              else {
                if (pvVar11 == (void *)0x0) {
                  pvVar11 = malloc(__size);
                }
                else {
                  pvVar11 = realloc(pvVar11,__size);
                }
                *(void **)(__ptr_00 + 2) = pvVar11;
                uVar23 = (ulong)uVar20;
              }
            }
            else {
              pvVar11 = *(void **)(__ptr_00 + 2);
            }
            *(void **)((long)pvVar11 + lVar17 * 8 + lVar10 * 8) = pvVar6;
            if (pvMap != (Vec_Int_t **)0x0) {
              Vec_IntPush(*pvMap,(int)lVar15);
            }
            lVar17 = lVar17 + 1;
            uVar20 = uVar20 + 2;
            __size = __size + 0x10;
          } while (iVar22 != lVar17);
          uVar20 = iVar16 + (int)lVar17;
          uVar19 = (ulong)uVar20;
          __ptr_00[1] = uVar20;
          *__ptr_00 = (uint)uVar23;
        }
      }
      else {
        iVar22 = (int)uVar23;
        if (iVar16 == iVar22) {
          if (iVar22 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar6;
            *__ptr_00 = 0x10;
            uVar23 = 0x10;
          }
          else {
            uVar23 = (ulong)(uint)(iVar22 * 2);
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar6 = malloc(uVar23 * 8);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr_00 + 2),uVar23 * 8);
            }
            *(void **)(__ptr_00 + 2) = pvVar6;
            *__ptr_00 = iVar22 * 2;
          }
        }
        else {
          pvVar6 = *(void **)(__ptr_00 + 2);
        }
        __ptr_00[1] = iVar16 + 1U;
        *(ulong *)((long)pvVar6 + (long)iVar16 * 8) = uVar3 ^ uVar18 ^ 1;
        if (pvMap != (Vec_Int_t **)0x0) {
          Vec_IntPush(*pvMap,(int)lVar15);
        }
        uVar19 = (ulong)(iVar16 + 1U);
      }
      lVar15 = lVar15 + 1;
      pVVar9 = pNtk->vPos;
    } while (lVar15 < pVVar9->nSize);
    __ptr = pVVar5->pArray;
  }
  if (__ptr != (void **)0x0) {
    free(__ptr);
  }
  free(pVVar5);
  p = Aig_ManStart(pNtk->nObjCounts[7] + 100);
  iVar16 = pNtk->nBarBufs;
  p->nConstrs = pNtk->nConstrs;
  p->nBarBufs = iVar16;
  pcVar12 = Extra_UtilStrsav(pNtk->pName);
  p->pName = pcVar12;
  pcVar12 = Extra_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar12;
  aVar4 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
  pAVar13 = Abc_AigConst1(pNtk);
  pAVar13->field_6 = aVar4;
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar15 = 0;
    do {
      pvVar6 = pVVar5->pArray[lVar15];
      pAVar14 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar6 + 0x40) = pAVar14;
      lVar15 = lVar15 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar15 < pVVar5->nSize);
  }
  pVVar5 = pNtk->vBoxes;
  if (0 < pVVar5->nSize) {
    lVar15 = 0;
    do {
      plVar2 = (long *)pVVar5->pArray[lVar15];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        puVar1 = (ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                    (long)*(int *)plVar2[6] * 8) + 0x40);
        *puVar1 = *puVar1 ^ (ulong)(plVar2[7] == 2);
        pVVar5 = pNtk->vBoxes;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar5->nSize);
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar15 = 0;
    do {
      plVar2 = (long *)pVVar5->pArray[lVar15];
      if ((plVar2 != (long *)0x0) && (uVar20 = *(uint *)((long)plVar2 + 0x14), (uVar20 & 0xf) == 7))
      {
        lVar10 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        pAVar14 = Aig_And(p,(Aig_Obj_t *)
                            ((ulong)(uVar20 >> 10 & 1) ^
                            *(ulong *)(*(long *)(lVar10 + (long)*(int *)plVar2[4] * 8) + 0x40)),
                          (Aig_Obj_t *)
                          ((ulong)(uVar20 >> 0xb & 1) ^
                          *(ulong *)(*(long *)(lVar10 + (long)((int *)plVar2[4])[1] * 8) + 0x40)));
        plVar2[8] = (long)pAVar14;
        pVVar5 = pNtk->vObjs;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar5->nSize);
  }
  pvVar6 = *(void **)(__ptr_00 + 2);
  if ((int)uVar19 < 1) {
    if (pvVar6 == (void *)0x0) goto LAB_002a3c98;
  }
  else {
    uVar23 = 0;
    do {
      uVar3 = *(ulong *)((long)pvVar6 + uVar23 * 8);
      Aig_ObjCreateCo(p,(Aig_Obj_t *)
                        ((ulong)((uint)uVar3 & 1) ^ *(ulong *)((uVar3 & 0xfffffffffffffffe) + 0x40)
                        ^ 1));
      uVar23 = uVar23 + 1;
    } while (uVar19 != uVar23);
  }
  free(pvVar6);
LAB_002a3c98:
  free(__ptr_00);
  pVVar5 = pNtk->vBoxes;
  if (0 < pVVar5->nSize) {
    lVar15 = 0;
    do {
      plVar2 = (long *)pVVar5->pArray[lVar15];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        lVar10 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        lVar17 = *(long *)(lVar10 + (long)*(int *)plVar2[6] * 8);
        if ((*(uint *)(lVar17 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a9,"int Abc_LatchIsInit1(Abc_Obj_t *)");
        }
        Aig_ObjCreateCo(p,(Aig_Obj_t *)
                          ((ulong)(*(long *)(lVar17 + 0x38) == 2) ^
                          (ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(lVar10 + (long)*(int *)plVar2[4] * 8) + 0x40)));
        pVVar5 = pNtk->vBoxes;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar5->nSize);
  }
  Aig_ManSetRegNum(p,pNtk->nObjCounts[8]);
  Aig_ManCleanup(p);
  pAVar21 = p;
  iVar16 = Aig_ManCheck(p);
  if (iVar16 == 0) {
    Abc_Print((int)pAVar21,"Abc_NtkToDarBmc: AIG check has failed.\n");
    Aig_ManStop(p);
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

Aig_Man_t * Abc_NtkToDarBmc( Abc_Ntk_t * pNtk, Vec_Int_t ** pvMap )
{
    Aig_Man_t * pMan;
    Abc_Obj_t * pObj, * pTemp;
    Vec_Ptr_t * vDrivers;
    Vec_Ptr_t * vSuper;
    int i, k, nDontCares;

    // print warning about initial values
    nDontCares = 0;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( Abc_LatchIsInitDc(pObj) )
        {
            Abc_LatchSetInit0(pObj);
            nDontCares++;
        }
    if ( nDontCares )
    {
        Abc_Print( 1, "Warning: %d registers in this network have don't-care init values.\n", nDontCares );
        Abc_Print( 1, "The don't-care are assumed to be 0. The result may not verify.\n" );
        Abc_Print( 1, "Use command \"print_latch\" to see the init values of registers.\n" );
        Abc_Print( 1, "Use command \"zero\" to convert or \"init\" to change the values.\n" );
    }

    // collect the drivers
    vSuper   = Vec_PtrAlloc( 100 );
    vDrivers = Vec_PtrAlloc( 100 );
    if ( pvMap ) 
    *pvMap   = Vec_IntAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( pNtk->nConstrs && i >= pNtk->nConstrs )
        {
            Vec_PtrPush( vDrivers, Abc_ObjNot(Abc_ObjChild0(pObj)) );
            if ( pvMap )
            Vec_IntPush( *pvMap, i );
            continue;
        }
        Abc_CollectTopOr( Abc_ObjChild0(pObj), vSuper );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pTemp, k )
        {
            Vec_PtrPush( vDrivers, pTemp );
            if ( pvMap )
            Vec_IntPush( *pvMap, i );
        }       
    }
    Vec_PtrFree( vSuper );

    // create network
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
    // create flops
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNotCond( Abc_ObjFanout0(pObj)->pCopy, Abc_LatchIsInit1(pObj) );
    // copy internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
    // create the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vDrivers, pTemp, k )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjNotCond(Abc_ObjRegular(pTemp)->pCopy, !Abc_ObjIsComplement(pTemp)) );
    Vec_PtrFree( vDrivers );
    // create flops
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjNotCond(Abc_ObjChild0Copy(pObj), Abc_LatchIsInit1(Abc_ObjFanout0(pObj))) );

    // remove dangling nodes
    Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
    Aig_ManCleanup( pMan );
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDarBmc: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}